

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcCovering::~IfcCovering(IfcCovering *this)

{
  *(undefined8 *)&this[-1].field_0x50 = 0x876450;
  *(undefined8 *)&this->field_0x38 = 0x876568;
  *(undefined8 *)&this[-1].field_0xd8 = 0x876478;
  *(undefined8 *)&this[-1].field_0xe8 = 0x8764a0;
  *(undefined8 *)&this[-1].field_0x120 = 0x8764c8;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0x8764f0;
  *(undefined8 *)&this[-1].field_0x188 = 0x876518;
  *(undefined8 *)this = 0x876540;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x50,&PTR_construction_vtable_24__00876588);
  operator_delete(&this[-1].field_0x50,0x198);
  return;
}

Assistant:

IfcCovering() : Object("IfcCovering") {}